

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O0

void SkipSubBlock(FScanner *sc)

{
  bool bVar1;
  int local_14;
  int depth;
  FScanner *sc_local;
  
  FScanner::MustGetStringName(sc,"{");
  local_14 = 1;
  while (0 < local_14) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"{");
    if (bVar1) {
      local_14 = local_14 + 1;
    }
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) {
      local_14 = local_14 + -1;
    }
  }
  return;
}

Assistant:

static void SkipSubBlock(FScanner &sc)
{
	sc.MustGetStringName("{");
	int depth = 1;
	while (depth > 0)
	{
		sc.MustGetString();
		if (sc.Compare("{")) depth++;
		if (sc.Compare("}")) depth--;
	}
}